

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalIEJoin::ResolveComplexJoin
          (PhysicalIEJoin *this,ExecutionContext *context,DataChunk *result,
          LocalSourceState *state_p)

{
  SelectionVector *true_sel;
  DataChunk *this_00;
  _Head_base<0UL,_bool_*,_false> _Var1;
  sel_t *psVar2;
  pointer pGVar3;
  reference pvVar4;
  type pGVar5;
  type pGVar6;
  const_reference pvVar7;
  pointer this_01;
  _func_int **result_count;
  SelectionVector *sel;
  reference result_00;
  reference result_01;
  const_reference pvVar8;
  _func_int **pp_Var9;
  idx_t left_cols;
  ulong uVar10;
  size_type __n;
  _func_int **pp_Var11;
  _func_int **pp_Var12;
  SelectionVector rsel;
  SelectionVector lsel;
  DataChunk right_chunk;
  SelectionVector local_128;
  LocalSourceState *local_110;
  type local_108;
  type local_100;
  GlobalSortState *local_f8;
  GlobalSortState *local_f0;
  LocalSourceState *local_e8;
  vector<duckdb::JoinCondition,_true> *local_e0;
  ExpressionExecutor *local_d8;
  vector<duckdb::Vector,_true> *local_d0;
  ExpressionExecutor *local_c8;
  vector<duckdb::Vector,_true> *local_c0;
  SelectionVector local_b8;
  BufferHandle local_a0;
  BufferHandle local_88;
  DataChunk local_70;
  
  pGVar3 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                         *)(pGVar3 + 1),0);
  pGVar5 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator*(pvVar4);
  pvVar4 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::operator[]((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                         *)(pGVar3 + 1),1);
  pGVar6 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator*(pvVar4);
  pvVar7 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                     (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       children,0);
  left_cols = ((long)(pvVar7->_M_data->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar7->_M_data->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  this_00 = (DataChunk *)(state_p + 0x2c);
  local_e8 = state_p + 2;
  local_f0 = &pGVar5->global_sort_state;
  local_f8 = &pGVar6->global_sort_state;
  local_e0 = &(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions;
  local_c8 = (ExpressionExecutor *)(state_p + 10);
  local_d8 = (ExpressionExecutor *)(state_p + 0x1b);
  true_sel = (SelectionVector *)(state_p + 7);
  local_c0 = (vector<duckdb::Vector,_true> *)(state_p + 0x13);
  local_d0 = (vector<duckdb::Vector,_true> *)(state_p + 0x24);
  local_110 = state_p;
  local_108 = pGVar6;
  local_100 = pGVar5;
  do {
    SelectionVector::SelectionVector(&local_b8,0x800);
    SelectionVector::SelectionVector(&local_128,0x800);
    this_01 = unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>::
              operator->((unique_ptr<duckdb::IEJoinUnion,_std::default_delete<duckdb::IEJoinUnion>,_true>
                          *)local_e8);
    result_count = (_func_int **)IEJoinUnion::JoinComplexBlocks(this_01,&local_b8,&local_128);
    if (result_count == (_func_int **)0x0) {
      if (local_128.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_b8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return;
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      return;
    }
    DataChunk::Reset(this_00);
    PhysicalRangeJoin::SliceSortedPayload
              (&local_88,this_00,local_f0,(idx_t)state_p[4]._vptr_LocalSourceState,&local_b8,
               (idx_t)result_count,0);
    BufferHandle::~BufferHandle(&local_88);
    PhysicalRangeJoin::SliceSortedPayload
              (&local_a0,this_00,local_f8,(idx_t)state_p[6]._vptr_LocalSourceState,&local_128,
               (idx_t)result_count,left_cols);
    BufferHandle::~BufferHandle(&local_a0);
    state_p[0x2f]._vptr_LocalSourceState = result_count;
    sel = FlatVector::IncrementalSelectionVector();
    uVar10 = ((long)*(pointer *)
                     ((long)&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions
                             .
                             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             .
                             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              (long)(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions.
                    super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                    super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    if (2 < uVar10) {
      DataChunk::DataChunk(&local_70);
      DataChunk::Split(this_00,&local_70,left_cols);
      state_p[0xd]._vptr_LocalSourceState = (_func_int **)this_00;
      state_p[0x1e]._vptr_LocalSourceState = (_func_int **)&local_70;
      pp_Var9 = result_count;
      if (uVar10 != 2) {
        __n = 0;
        do {
          result_00 = vector<duckdb::Vector,_true>::operator[](local_c0,__n);
          ExpressionExecutor::ExecuteExpression(local_c8,__n,result_00);
          result_01 = vector<duckdb::Vector,_true>::operator[](local_d0,__n);
          ExpressionExecutor::ExecuteExpression(local_d8,__n,result_01);
          if (pp_Var9 < result_count) {
            Vector::Slice(result_00,sel,(idx_t)pp_Var9);
            Vector::Slice(result_01,sel,(idx_t)pp_Var9);
          }
          pvVar8 = vector<duckdb::JoinCondition,_true>::operator[](local_e0,__n + 2);
          pp_Var9 = (_func_int **)
                    PhysicalRangeJoin::SelectJoinTail
                              (&pvVar8->comparison,result_00,result_01,sel,(idx_t)pp_Var9,true_sel);
          __n = __n + 1;
          state_p = local_110;
          sel = true_sel;
        } while (__n != uVar10 - 2);
      }
      DataChunk::Fuse(this_00,&local_70);
      if (pp_Var9 < result_count) {
        DataChunk::Slice(this_00,sel,(idx_t)pp_Var9);
        result_count = pp_Var9;
      }
      DataChunk::~DataChunk(&local_70);
    }
    PhysicalRangeJoin::ProjectResult(&this->super_PhysicalRangeJoin,this_00,result);
    _Var1._M_head_impl =
         (local_100->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    if ((_Var1._M_head_impl != (bool *)0x0) && (result_count != (_func_int **)0x0)) {
      psVar2 = sel->sel_vector;
      pp_Var9 = state_p[3]._vptr_LocalSourceState;
      pp_Var11 = (_func_int **)0x0;
      do {
        pp_Var12 = pp_Var11;
        if (psVar2 != (sel_t *)0x0) {
          pp_Var12 = (_func_int **)(ulong)psVar2[(long)pp_Var11];
        }
        *(bool *)((long)pp_Var9 + (long)(_Var1._M_head_impl + local_b8.sel_vector[(long)pp_Var12]))
             = true;
        pp_Var11 = (_func_int **)((long)pp_Var11 + 1);
      } while (result_count != pp_Var11);
    }
    _Var1._M_head_impl =
         (local_108->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    if ((_Var1._M_head_impl != (bool *)0x0) && (result_count != (_func_int **)0x0)) {
      psVar2 = sel->sel_vector;
      pp_Var9 = state_p[5]._vptr_LocalSourceState;
      pp_Var11 = (_func_int **)0x0;
      do {
        pp_Var12 = pp_Var11;
        if (psVar2 != (sel_t *)0x0) {
          pp_Var12 = (_func_int **)(ulong)psVar2[(long)pp_Var11];
        }
        *(bool *)((long)pp_Var9 + (long)(_Var1._M_head_impl + local_128.sel_vector[(long)pp_Var12]))
             = true;
        pp_Var11 = (_func_int **)((long)pp_Var11 + 1);
      } while (result_count != pp_Var11);
    }
    DataChunk::Verify(result);
    if (local_128.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_b8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  } while (result->count == 0);
  return;
}

Assistant:

void PhysicalIEJoin::ResolveComplexJoin(ExecutionContext &context, DataChunk &result, LocalSourceState &state_p) const {
	auto &state = state_p.Cast<IEJoinLocalSourceState>();
	auto &ie_sink = sink_state->Cast<IEJoinGlobalState>();
	auto &left_table = *ie_sink.tables[0];
	auto &right_table = *ie_sink.tables[1];

	const auto left_cols = children[0].get().GetTypes().size();
	auto &chunk = state.unprojected;
	do {
		SelectionVector lsel(STANDARD_VECTOR_SIZE);
		SelectionVector rsel(STANDARD_VECTOR_SIZE);
		auto result_count = state.joiner->JoinComplexBlocks(lsel, rsel);
		if (result_count == 0) {
			// exhausted this pair
			return;
		}

		// found matches: extract them

		chunk.Reset();
		SliceSortedPayload(chunk, left_table.global_sort_state, state.left_block_index, lsel, result_count, 0);
		SliceSortedPayload(chunk, right_table.global_sort_state, state.right_block_index, rsel, result_count,
		                   left_cols);
		chunk.SetCardinality(result_count);

		auto sel = FlatVector::IncrementalSelectionVector();
		if (conditions.size() > 2) {
			// If there are more expressions to compute,
			// split the result chunk into the left and right halves
			// so we can compute the values for comparison.
			const auto tail_cols = conditions.size() - 2;

			DataChunk right_chunk;
			chunk.Split(right_chunk, left_cols);
			state.left_executor.SetChunk(chunk);
			state.right_executor.SetChunk(right_chunk);

			auto tail_count = result_count;
			auto true_sel = &state.true_sel;
			for (size_t cmp_idx = 0; cmp_idx < tail_cols; ++cmp_idx) {
				auto &left = state.left_keys.data[cmp_idx];
				state.left_executor.ExecuteExpression(cmp_idx, left);

				auto &right = state.right_keys.data[cmp_idx];
				state.right_executor.ExecuteExpression(cmp_idx, right);

				if (tail_count < result_count) {
					left.Slice(*sel, tail_count);
					right.Slice(*sel, tail_count);
				}
				tail_count = SelectJoinTail(conditions[cmp_idx + 2].comparison, left, right, sel, tail_count, true_sel);
				sel = true_sel;
			}
			chunk.Fuse(right_chunk);

			if (tail_count < result_count) {
				result_count = tail_count;
				chunk.Slice(*sel, result_count);
			}
		}

		//	We need all of the data to compute other predicates,
		//	but we only return what is in the projection map
		ProjectResult(chunk, result);

		// found matches: mark the found matches if required
		if (left_table.found_match) {
			for (idx_t i = 0; i < result_count; i++) {
				left_table.found_match[state.left_base + lsel[sel->get_index(i)]] = true;
			}
		}
		if (right_table.found_match) {
			for (idx_t i = 0; i < result_count; i++) {
				right_table.found_match[state.right_base + rsel[sel->get_index(i)]] = true;
			}
		}
		result.Verify();
	} while (result.size() == 0);
}